

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoReportTopmost(Gia_IsoMan_t *p)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  ulong uVar10;
  bool bVar11;
  
  Gia_ManIncrementTravId(p->pGia);
  uVar9 = 0;
  do {
    p_00 = p->vClasses;
    iVar2 = p_00->nSize;
    if (iVar2 <= (int)(uVar9 | 1)) {
      uVar9 = 0;
      do {
        if (iVar2 <= (int)(uVar9 | 1)) {
          return;
        }
        iVar2 = Vec_IntEntry(p_00,uVar9);
        uVar3 = Vec_IntEntry(p->vClasses,uVar9 | 1);
        lVar8 = (long)iVar2;
        uVar10 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar10 = 0;
        }
        do {
          bVar11 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar11) goto LAB_005b6b7f;
          pGVar6 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + lVar8 * 8 + 4));
          iVar4 = Gia_ObjIsTravIdCurrent(p->pGia,pGVar6);
          lVar8 = lVar8 + 1;
        } while (iVar4 != 0);
        printf("%5d : ");
        uVar5 = Gia_ObjId(p->pGia,pGVar6);
        piVar1 = p->pLevels;
        iVar4 = Gia_ObjId(p->pGia,pGVar6);
        printf("Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n",(ulong)uVar5,
               (ulong)(uint)piVar1[iVar4],iVar2,(ulong)uVar3);
LAB_005b6b7f:
        uVar9 = uVar9 + 2;
        p_00 = p->vClasses;
        iVar2 = p_00->nSize;
      } while( true );
    }
    iVar2 = Vec_IntEntry(p_00,uVar9);
    uVar3 = Vec_IntEntry(p->vClasses,uVar9 | 1);
    lVar8 = (long)iVar2;
    uVar10 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = 0;
    }
    while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
      pGVar6 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + lVar8 * 8 + 4));
      uVar7 = *(ulong *)pGVar6 & 0x1fffffff;
      if (uVar7 == 0x1fffffff || (int)*(ulong *)pGVar6 < 0) {
        iVar2 = Gia_ObjIsRo(p->pGia,pGVar6);
        if (iVar2 != 0) {
          p_01 = p->pGia;
          pGVar6 = Gia_ObjRoToRi(p_01,pGVar6);
          uVar3 = (uint)*(undefined8 *)pGVar6;
          goto LAB_005b6a8e;
        }
      }
      else {
        Gia_ObjSetTravIdCurrent(p->pGia,pGVar6 + -uVar7);
        p_01 = p->pGia;
        uVar3 = *(uint *)&pGVar6->field_0x4;
LAB_005b6a8e:
        Gia_ObjSetTravIdCurrent(p_01,pGVar6 + -(ulong)(uVar3 & 0x1fffffff));
      }
      lVar8 = lVar8 + 1;
    }
    uVar9 = uVar9 + 2;
  } while( true );
}

Assistant:

void Gia_IsoReportTopmost( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize, Counter = 0;
    // go through equivalence classes
    Gia_ManIncrementTravId( p->pGia );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
//        printf( "%d(%d) ", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(pObj) );
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin1(pObj) );
            }
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)) );
        }
    }
//    printf( "\n" );

    // report non-labeled nodes
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( !Gia_ObjIsTravIdCurrent(p->pGia, pObj) )
            {
                printf( "%5d : ", ++Counter );
                printf( "Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n", 
                    Gia_ObjId(p->pGia, pObj), p->pLevels[Gia_ObjId(p->pGia, pObj)], iBegin, nSize );
                break;
            }
        }
    }
}